

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  cmCommand *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  unsigned_long uVar6;
  char *pcVar7;
  mode_t local_2bc;
  string local_270 [8];
  string toPath;
  string fromPath;
  unsigned_long fileNum;
  unsigned_long numFiles;
  Directory dir;
  mode_t permissions_after;
  mode_t permissions_before;
  mode_t required_permissions;
  mode_t permissions;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream e;
  mode_t *local_40;
  mode_t *default_dir_mode;
  string *psStack_30;
  mode_t default_dir_mode_v;
  string *destination_local;
  string *source_local;
  cmFileCopier *this_local;
  mode_t mStack_10;
  MatchProperties match_properties_local;
  
  psStack_30 = destination;
  destination_local = source;
  source_local = (string *)this;
  unique0x100004c7 = match_properties;
  bVar1 = cmsys::SystemTools::FileIsDirectory(destination);
  (*this->_vptr_cmFileCopier[4])(this,destination,1,(ulong)((bVar1 ^ 0xff) & 1));
  default_dir_mode._4_4_ = 0;
  local_40 = (mode_t *)((long)&default_dir_mode + 4);
  bVar1 = GetDefaultDirectoryPermissions(this,&local_40);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::MakeDirectory(psStack_30,local_40);
    if (bVar1) {
      if (mStack_10 == 0) {
        local_2bc = this->DirPermissions;
      }
      else {
        local_2bc = mStack_10;
      }
      permissions_before = local_2bc;
      if (local_2bc == 0) {
        cmsys::SystemTools::GetPermissions(destination_local,&permissions_before);
      }
      dir.Internal._0_4_ = 0;
      if ((permissions_before & 0x1c0) == 0x1c0) {
        dir.Internal._4_4_ = permissions_before;
      }
      else {
        dir.Internal._4_4_ = permissions_before | 0x1c0;
        dir.Internal._0_4_ = permissions_before;
      }
      bVar1 = SetPermissions(this,psStack_30,dir.Internal._4_4_);
      if (bVar1) {
        cmsys::Directory::Directory((Directory *)&numFiles);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          cmsys::Directory::Load((Directory *)&numFiles,destination_local);
        }
        uVar6 = cmsys::Directory::GetNumberOfFiles((Directory *)&numFiles);
        for (fromPath.field_2._8_8_ = 0; (ulong)fromPath.field_2._8_8_ < uVar6;
            fromPath.field_2._8_8_ = fromPath.field_2._8_8_ + 1) {
          pcVar7 = cmsys::Directory::GetFile((Directory *)&numFiles,fromPath.field_2._8_8_);
          iVar2 = strcmp(pcVar7,".");
          if (iVar2 != 0) {
            pcVar7 = cmsys::Directory::GetFile((Directory *)&numFiles,fromPath.field_2._8_8_);
            iVar2 = strcmp(pcVar7,"..");
            if (iVar2 != 0) {
              std::__cxx11::string::string
                        ((string *)(toPath.field_2._M_local_buf + 8),(string *)destination_local);
              std::__cxx11::string::operator+=((string *)(toPath.field_2._M_local_buf + 8),"/");
              pcVar7 = cmsys::Directory::GetFile((Directory *)&numFiles,fromPath.field_2._8_8_);
              std::__cxx11::string::operator+=((string *)(toPath.field_2._M_local_buf + 8),pcVar7);
              std::__cxx11::string::string(local_270,(string *)psStack_30);
              std::__cxx11::string::operator+=(local_270,"/");
              pcVar7 = cmsys::Directory::GetFile((Directory *)&numFiles,fromPath.field_2._8_8_);
              std::__cxx11::string::operator+=(local_270,pcVar7);
              uVar3 = (*this->_vptr_cmFileCopier[2])
                                (this,(undefined1 *)((long)&toPath.field_2 + 8),local_270);
              bVar1 = (uVar3 & 1) == 0;
              if (bVar1) {
                match_properties_local._3_1_ = 0;
              }
              std::__cxx11::string::~string(local_270);
              std::__cxx11::string::~string((string *)(toPath.field_2._M_local_buf + 8));
              if (bVar1) goto LAB_004c8a42;
            }
          }
        }
        match_properties_local._3_1_ = SetPermissions(this,psStack_30,(mode_t)dir.Internal);
LAB_004c8a42:
        cmsys::Directory::~Directory((Directory *)&numFiles);
      }
      else {
        match_properties_local._3_1_ = 0;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar4 = std::operator<<((ostream *)local_1b8,this->Name);
      poVar4 = std::operator<<(poVar4," cannot make directory \"");
      poVar4 = std::operator<<(poVar4,(string *)psStack_30);
      poVar4 = std::operator<<(poVar4,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::operator<<(poVar4,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      this_00 = &this->FileCommand->super_cmCommand;
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(this_00,(string *)&required_permissions);
      std::__cxx11::string::~string((string *)&required_permissions);
      match_properties_local._3_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
  }
  else {
    match_properties_local._3_1_ = 0;
  }
  return (bool)(match_properties_local._3_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !cmSystemTools::FileIsDirectory(destination));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << cmSystemTools::GetLastSystemError();
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = source;
      fromPath += "/";
      fromPath += dir.GetFile(fileNum);
      std::string toPath = destination;
      toPath += "/";
      toPath += dir.GetFile(fileNum);
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}